

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O0

void __thiscall mathOps_fixedMeas_Test::~mathOps_fixedMeas_Test(mathOps_fixedMeas_Test *this)

{
  mathOps_fixedMeas_Test *this_local;
  
  ~mathOps_fixedMeas_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(mathOps, fixedMeas)
{
    fixed_measurement um1(5.69, m.pow(3));

    auto um2 = cbrt(um1);
    EXPECT_EQ(um2, root(um1, 3));

    auto um3 = floor(um1);
    EXPECT_FLOAT_EQ(um3.value(), 5.0F);

    auto um4 = trunc(um1);
    EXPECT_FLOAT_EQ(um4.value(), 5.0F);

    auto um5 = ceil(um1);
    EXPECT_FLOAT_EQ(um5.value(), 6.0F);

    auto um6 = round(um1);
    EXPECT_FLOAT_EQ(um6.value(), 6.0F);
}